

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O3

void deqp::gles2::Functional::anon_unknown_0::busyWait(int milliseconds)

{
  deUint64 dVar1;
  deUint64 dVar2;
  int i;
  int iVar3;
  float __x;
  
  iVar3 = 0;
  dVar1 = deGetMicroseconds();
  __x = 2.0;
  do {
    do {
      __x = sinf(__x);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 10);
    dVar2 = deGetMicroseconds();
    iVar3 = 0;
  } while (dVar2 - dVar1 < 1200000);
  return;
}

Assistant:

static void busyWait (int milliseconds)
{
	const deUint64	startTime	= deGetMicroseconds();
	float			v			= 2.0f;

	for (;;)
	{
		for (int i = 0; i < 10; i++)
			v = deFloatSin(v);

		if (deGetMicroseconds()-startTime >= deUint64(1000*milliseconds))
			break;
	}
}